

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_STATUS ref_egads_list_dependencies(char *list)

{
  *list = '\0';
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_list_dependencies(char list[1024]) {
  list[0] = '\0';
#if defined(HAVE_EGADS)
#if defined(HAVE_EGADS_LITE)
  strcat(list, " EGADSlite");
#else
  strcat(list, " EGADS(OpenCASCADE)");
#if defined(HAVE_EGADS_EFFECTIVE)
  strcat(list, "+Effective_Topology");
#endif
#endif
#endif
  return REF_SUCCESS;
}